

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_accumulator.cc
# Opt level: O1

void __thiscall justify::LineAccumulator::operator()(LineAccumulator *this,string *token)

{
  uchar *puVar1;
  uint uVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  int local_1c;
  
  pcVar3 = (token->_M_dataplus)._M_p;
  if (*pcVar3 == '\0') {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      pcVar3 = pcVar3 + 1;
      uVar5 = uVar5 + 1;
    } while (*pcVar3 != '\0');
  }
  uVar2 = (uint)(byte)(this->max_length_ - this->length_);
  if (this->max_length_ < this->length_) {
    uVar2 = 0;
  }
  if (uVar2 < uVar5) {
    discharge(this,true);
  }
  local_1c = 0;
  std::
  vector<std::pair<std::__cxx11::string,unsigned_char>,std::allocator<std::pair<std::__cxx11::string,unsigned_char>>>
  ::emplace_back<std::__cxx11::string_const&,int>
            ((vector<std::pair<std::__cxx11::string,unsigned_char>,std::allocator<std::pair<std::__cxx11::string,unsigned_char>>>
              *)&this->tokens_,token,&local_1c);
  bVar4 = (char)uVar5 + this->length_;
  this->length_ = bVar4;
  if (bVar4 < this->max_length_) {
    puVar1 = &(this->tokens_).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].second;
    *puVar1 = *puVar1 + '\x01';
    this->length_ = bVar4 + 1;
  }
  return;
}

Assistant:

void LineAccumulator::operator()(const std::string& token) {
	const std::size_t tokenLength = getCharacterLength(token);

	if ( tokenLength > this->getMissing() ) {
		this->discharge(true);
	}

	this->tokens_.emplace_back(token, 0);
	this->length_ += tokenLength;

	if ( this->getMissing() > 0 ) {
		this->tokens_.back().second += 1;
		this->length_               += 1;
	}
}